

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_make_inter_predictor
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,
               InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (inter_pred_params->mode == WARP_PRED) {
    av1_warp_plane(&inter_pred_params->warp_params,inter_pred_params->use_hbd_buf,
                   inter_pred_params->bit_depth,(inter_pred_params->ref_frame_buf).buf0,
                   (inter_pred_params->ref_frame_buf).width,
                   (inter_pred_params->ref_frame_buf).height,
                   (inter_pred_params->ref_frame_buf).stride,dst,inter_pred_params->pix_col,
                   inter_pred_params->pix_row,inter_pred_params->block_width,
                   inter_pred_params->block_height,dst_stride,inter_pred_params->subsampling_x,
                   inter_pred_params->subsampling_y,&inter_pred_params->conv_params);
  }
  else if (inter_pred_params->mode == TRANSLATION_PRED) {
    if (inter_pred_params->use_hbd_buf == 0) {
      iVar5 = subpel_params->xs;
      iVar6 = subpel_params->ys;
      bVar1 = iVar6 != 0x400;
      bVar2 = iVar5 != 0x400;
      iVar3 = subpel_params->subpel_x;
      iVar4 = subpel_params->subpel_y;
      if (!bVar1 && !bVar2) {
        iVar3 = iVar3 >> 6;
        iVar4 = iVar4 >> 6;
        iVar5 = 0x10;
        iVar6 = 0x10;
      }
      av1_convolve_2d_facade
                (src,src_stride,dst,dst_stride,inter_pred_params->block_width,
                 inter_pred_params->block_height,inter_pred_params->interp_filter_params,iVar3,iVar5
                 ,iVar4,iVar6,(uint)(bVar1 || bVar2),&inter_pred_params->conv_params);
    }
    else {
      iVar5 = subpel_params->xs;
      iVar6 = subpel_params->ys;
      bVar1 = iVar6 != 0x400;
      bVar2 = iVar5 != 0x400;
      iVar3 = subpel_params->subpel_x;
      iVar4 = subpel_params->subpel_y;
      if (!bVar1 && !bVar2) {
        iVar3 = iVar3 >> 6;
        iVar4 = iVar4 >> 6;
        iVar5 = 0x10;
        iVar6 = 0x10;
      }
      av1_highbd_convolve_2d_facade
                (src,src_stride,dst,dst_stride,inter_pred_params->block_width,
                 inter_pred_params->block_height,inter_pred_params->interp_filter_params,iVar3,iVar5
                 ,iVar4,iVar6,(uint)(bVar1 || bVar2),&inter_pred_params->conv_params,
                 inter_pred_params->bit_depth);
    }
  }
  return;
}

Assistant:

void av1_make_inter_predictor(const uint8_t *src, int src_stride, uint8_t *dst,
                              int dst_stride,
                              InterPredParams *inter_pred_params,
                              const SubpelParams *subpel_params) {
  assert(IMPLIES(inter_pred_params->conv_params.is_compound,
                 inter_pred_params->conv_params.dst != NULL));

  if (inter_pred_params->mode == TRANSLATION_PRED) {
#if CONFIG_AV1_HIGHBITDEPTH
    if (inter_pred_params->use_hbd_buf) {
      highbd_inter_predictor(src, src_stride, dst, dst_stride, subpel_params,
                             inter_pred_params->block_width,
                             inter_pred_params->block_height,
                             &inter_pred_params->conv_params,
                             inter_pred_params->interp_filter_params,
                             inter_pred_params->bit_depth);
    } else {
      inter_predictor(src, src_stride, dst, dst_stride, subpel_params,
                      inter_pred_params->block_width,
                      inter_pred_params->block_height,
                      &inter_pred_params->conv_params,
                      inter_pred_params->interp_filter_params);
    }
#else
    inter_predictor(src, src_stride, dst, dst_stride, subpel_params,
                    inter_pred_params->block_width,
                    inter_pred_params->block_height,
                    &inter_pred_params->conv_params,
                    inter_pred_params->interp_filter_params);
#endif
  }
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  // TODO(jingning): av1_warp_plane() can be further cleaned up.
  else if (inter_pred_params->mode == WARP_PRED) {
    av1_warp_plane(
        &inter_pred_params->warp_params, inter_pred_params->use_hbd_buf,
        inter_pred_params->bit_depth, inter_pred_params->ref_frame_buf.buf0,
        inter_pred_params->ref_frame_buf.width,
        inter_pred_params->ref_frame_buf.height,
        inter_pred_params->ref_frame_buf.stride, dst,
        inter_pred_params->pix_col, inter_pred_params->pix_row,
        inter_pred_params->block_width, inter_pred_params->block_height,
        dst_stride, inter_pred_params->subsampling_x,
        inter_pred_params->subsampling_y, &inter_pred_params->conv_params);
  }
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  else {
    assert(0 && "Unsupported inter_pred_params->mode");
  }
}